

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

ON_Xform * operator*(ON_Xform *__return_storage_ptr__,double c,ON_Xform *xform)

{
  long lVar1;
  ulong uVar2;
  double *pdVar3;
  
  pdVar3 = (double *)__return_storage_ptr__;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar3 = *(double *)xform;
    xform = (ON_Xform *)((long)xform + 8);
    pdVar3 = pdVar3 + 1;
  }
  uVar2 = 0xfffffffffffffff8;
  do {
    *(double *)((long)__return_storage_ptr__->m_xform[0] + uVar2 + 8) =
         *(double *)((long)__return_storage_ptr__->m_xform[0] + uVar2 + 8) * c;
    uVar2 = uVar2 + 8;
  } while (uVar2 < 0x78);
  return __return_storage_ptr__;
}

Assistant:

const ON_Xform operator*(double c, const ON_Xform& xform)
{
  ON_Xform cx(xform);
  double* p = &cx.m_xform[0][0];
  double* p1 = p + 16;
  while (p < p1)
  {
    const double x = *p;
    *p++ = c*x;
  }
  return cx;
}